

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BubbleJson.cpp
# Opt level: O2

ParseResults __thiscall
bubbleJson::BubbleJson::ParseStringRaw(BubbleJson *this,char **refString,size_t *refLength)

{
  char cVar1;
  BubbleContext *pBVar2;
  uint uVar3;
  char *pcVar4;
  size_t sVar5;
  BubbleJson *this_00;
  char *ch;
  uint highSurrogate;
  uint lowSurrogate;
  char **local_40;
  size_t *local_38;
  
  pBVar2 = this->context;
  sVar5 = pBVar2->top;
  this_00 = this;
  local_40 = refString;
  local_38 = refLength;
  Expect(this,'\"');
  ch = pBVar2->json;
  do {
    while (cVar1 = *ch, cVar1 != '\\') {
      if (cVar1 == '\0') {
        pBVar2->top = sVar5;
        return ParseResult_MissQuotationMark;
      }
      ch = ch + 1;
      if (cVar1 == '\"') {
        sVar5 = pBVar2->top - sVar5;
        pcVar4 = (char *)ContextPop(this,sVar5);
        *local_40 = pcVar4;
        *local_38 = sVar5;
        pBVar2->json = ch;
        return ParseResult_Ok;
      }
      if (cVar1 < ' ') {
        pBVar2->top = sVar5;
        return ParseResult_InvalidStringChar;
      }
      this_00 = this;
      ContextPushChar(this,cVar1);
    }
    cVar1 = ch[1];
    ch = ch + 2;
    switch(cVar1) {
    case 'n':
      this_00 = this;
      ContextPushChar(this,'\n');
      break;
    case 'o':
    case 'p':
    case 'q':
    case 's':
switchD_0010f453_caseD_6f:
      pBVar2->top = sVar5;
      return ParseResult_InvalidStringEscape;
    case 'r':
      this_00 = this;
      ContextPushChar(this,'\r');
      break;
    case 't':
      this_00 = this;
      ContextPushChar(this,'\t');
      break;
    case 'u':
      ch = ParseHexToInt(this_00,ch,&highSurrogate);
      uVar3 = highSurrogate;
      if (ch == (char *)0x0) {
        pBVar2->top = sVar5;
        return ParseResult_InvalidUnicodeHex;
      }
      if ((highSurrogate & 0xfffffc00) == 0xd800) {
        if ((*ch != '\\') || (ch[1] != 'u')) {
LAB_0010f5bc:
          pBVar2->top = sVar5;
          return ParseResult_InvalidUnicodeSurrogate;
        }
        ch = ParseHexToInt(this_00,ch + 2,&lowSurrogate);
        if (ch == (char *)0x0) {
          pBVar2->top = sVar5;
          return ParseResult_InvalidUnicodeHex;
        }
        if (lowSurrogate - 0xe000 < 0xfffffc00) goto LAB_0010f5bc;
        highSurrogate = uVar3 * 0x400 + lowSurrogate + 0xfca02400;
      }
      this_00 = this;
      EncodeUTF8(this,highSurrogate);
      break;
    default:
      if (cVar1 == 'f') {
        this_00 = this;
        ContextPushChar(this,'\f');
      }
      else if (cVar1 == '/') {
        this_00 = this;
        ContextPushChar(this,'/');
      }
      else if (cVar1 == '\\') {
        this_00 = this;
        ContextPushChar(this,'\\');
      }
      else if (cVar1 == 'b') {
        this_00 = this;
        ContextPushChar(this,'\b');
      }
      else {
        if (cVar1 != '\"') goto switchD_0010f453_caseD_6f;
        this_00 = this;
        ContextPushChar(this,'\"');
      }
    }
  } while( true );
}

Assistant:

ParseResults BubbleJson::ParseStringRaw(char **refString, size_t *refLength)
{
    BubbleContext* c = this->context;
    size_t originTop = c->top;
    size_t lenght;
    unsigned highSurrogate, lowSurrogate;

    auto ReturnError = [=,&c](ParseResults parseResult){
        c->top = originTop;
        return parseResult;
    };

    Expect('\"');
    const char* p = c->json;
    while (true)
    {
        //traverse json
        char ch = *p;
        p++;
        switch (ch)
        {
            case '\"':
                lenght = c->top - originTop;
                *refString = (char *) ContextPop(lenght);
                *refLength = lenght;
                //current p point '\"' character
                c->json = p;
                return ParseResult_Ok;
            case '\\':
                switch (*p++) {
                    case '\"':
                        ContextPushChar('\"'); break;
                    case '\\':
                        ContextPushChar('\\'); break;
                    case '/':
                        ContextPushChar('/'); break;
                    case 'b':
                        ContextPushChar('\b'); break;
                    case 'f':
                        ContextPushChar('\f'); break;
                    case 'n':
                        ContextPushChar('\n'); break;
                    case 'r':
                        ContextPushChar('\r'); break;
                    case 't':
                        ContextPushChar('\t'); break;
                    case 'u':
                        if (!(p = ParseHexToInt(p, &highSurrogate)))
                            return ReturnError(ParseResult_InvalidUnicodeHex);
                        if (highSurrogate >= 0xD800 && highSurrogate <= 0xDBFF)//surrogate pair
                        {
                            if (*p++ != '\\')
                                return ReturnError(ParseResult_InvalidUnicodeSurrogate);
                            if (*p++ != 'u')
                                return ReturnError(ParseResult_InvalidUnicodeSurrogate);
                            if (!(p = ParseHexToInt(p, &lowSurrogate)))
                                return ReturnError(ParseResult_InvalidUnicodeHex);
                            if (lowSurrogate < 0xDC00 || lowSurrogate > 0xDFFF)
                                return ReturnError(ParseResult_InvalidUnicodeSurrogate);
                            highSurrogate = (((highSurrogate - 0xD800) << 10) | (lowSurrogate - 0xDC00)) + 0x10000;
                        }
                        EncodeUTF8(highSurrogate);
                        break;
                    default:
                        c->top = originTop;
                        return ParseResult_InvalidStringEscape;
                }
                break;
            case '\0':
                c->top = originTop;
                return ParseResult_MissQuotationMark;
            default:
                if (ch < 0x20)
                {
                    c->top = originTop;
                    return ParseResult_InvalidStringChar;
                }
                ContextPushChar(ch);
        }
    }
}